

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> * __thiscall
kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator=
          (ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *other)

{
  Question *pQVar1;
  RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *pRVar2;
  Question *pQVar3;
  
  pQVar1 = this->ptr;
  if (pQVar1 != (Question *)0x0) {
    pRVar2 = this->pos;
    pQVar3 = this->endPtr;
    this->ptr = (Question *)0x0;
    this->pos = (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)0x0;
    this->endPtr = (Question *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pQVar1,0x28,((long)pRVar2 - (long)pQVar1 >> 3) * -0x3333333333333333,
               ((long)pQVar3 - (long)pQVar1 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<capnp::_::RpcSystemBase::RpcConnectionState::Question>::
               destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Question *)0x0;
  other->pos = (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)0x0;
  other->endPtr = (Question *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }